

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

void itemHelp(FILE *fp,poptItem items,wchar_t nitems,columns_t columns,char *translation_domain)

{
  columns_t translation_domain_00;
  wchar_t wVar1;
  poptOption *opt;
  bool bVar2;
  
  if (items != (poptItem)0x0) {
    translation_domain_00 = columns;
    wVar1 = L'\0';
    if (L'\0' < nitems) {
      wVar1 = nitems;
    }
    while (bVar2 = wVar1 != L'\0', wVar1 = wVar1 + L'\xffffffff', bVar2) {
      if ((((items->option).longName != (char *)0x0) || ((items->option).shortName != '\0')) &&
         (((items->option).argInfo & 0x40000000) == 0)) {
        singleOptionHelp(fp,columns,&items->option,(char *)translation_domain_00);
      }
      items = items + 1;
    }
  }
  return;
}

Assistant:

static void itemHelp(FILE * fp,
		poptItem items, int nitems,
		columns_t columns,
		const char * translation_domain)
{
    poptItem item;
    int i;

    if (items != NULL)
    for (i = 0, item = items; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN))
	    singleOptionHelp(fp, columns, opt, translation_domain);
    }
}